

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
          *handler)

{
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  *psVar1;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *this_00;
  dynamic_format_specs<char> *pdVar2;
  internal iVar3;
  uint uVar4;
  size_t sVar5;
  internal *piVar6;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
  *eh;
  null_terminating_iterator<char> nVar7;
  null_terminating_iterator<char> local_28;
  
  eh = (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
        *)it.end_;
  local_28.end_ = it.ptr_;
  if (this == (internal *)local_28.end_) {
    iVar3 = (internal)0x0;
  }
  else {
    iVar3 = *this;
  }
  local_28.ptr_ = (char *)this;
  if ((iVar3 == (internal)0x7d) ||
     (handler = (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
                 *)(ulong)(byte)iVar3, iVar3 == (internal)0x3a)) {
    dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>::
    on_dynamic_width<fmt::v5::internal::auto_id>
              (&eh->handler->
                super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
               ,local_28.end_,eh,handler);
  }
  else {
    if ((byte)((char)iVar3 - 0x30U) < 10) {
      uVar4 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&,char>&>
                        (&local_28,eh);
      if ((local_28.ptr_ != local_28.end_) &&
         (((internal)*local_28.ptr_ == (internal)0x7d ||
          ((local_28.ptr_ != local_28.end_ && ((internal)*local_28.ptr_ == (internal)0x3a)))))) {
        psVar1 = eh->handler;
        this_00 = (psVar1->
                  super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
                  ).context_;
        if (this_00->next_arg_id_ < 1) {
          this_00->next_arg_id_ = -1;
        }
        else {
          basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
                    (this_00,"cannot switch from automatic to manual argument indexing");
        }
        pdVar2 = (psVar1->
                 super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
                 ).specs_;
        (pdVar2->width_ref).kind = INDEX;
        (pdVar2->width_ref).field_1.index = uVar4;
        goto LAB_00130f4f;
      }
    }
    else if ((iVar3 == (internal)0x5f) || ((byte)(((byte)iVar3 & 0xdf) + 0xbf) < 0x1a)) {
      sVar5 = 0;
      piVar6 = this + 1;
      do {
        local_28.ptr_ = (char *)piVar6;
        if (local_28.ptr_ == local_28.end_) {
          iVar3 = (internal)0x0;
        }
        else {
          iVar3 = (internal)*local_28.ptr_;
        }
        sVar5 = sVar5 + 1;
        piVar6 = (internal *)local_28.ptr_ + 1;
      } while ((((byte)((char)iVar3 - 0x30U) < 10) || (iVar3 == (internal)0x5f)) ||
              ((byte)(((byte)iVar3 & 0xdf) + 0xbf) < 0x1a));
      if ((long)sVar5 < 0) {
        __assert_fail("(value >= 0) && \"negative value\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/core.h"
                      ,0xde,
                      "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                     );
      }
      pdVar2 = (eh->handler->
               super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
               ).specs_;
      (pdVar2->width_ref).kind = NAME;
      (pdVar2->width_ref).field_1.name.data_ = (char *)this;
      (pdVar2->width_ref).field_1.name.size_ = sVar5;
      goto LAB_00130f4f;
    }
    basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
              ((eh->handler->
               super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
               ).context_,"invalid format string");
  }
LAB_00130f4f:
  nVar7.end_ = local_28.end_;
  nVar7.ptr_ = local_28.ptr_;
  return nVar7;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(
            pointer_from(start), to_unsigned(it - start)));
  return it;
}